

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anandan.c
# Opt level: O1

void init_kernel_a(kernel_t *ker)

{
  ker->k[0] = 1.0;
  ker->k[1] = 5.0;
  ker->k[2] = 8.0;
  ker->k[3] = 5.0;
  ker->k[4] = 1.0;
  ker->f = 20.0;
  ker->m = 5;
  return;
}

Assistant:

void init_kernel_a(ker)
kernel_t *ker ;

{
  (*ker).k[0] = 1.0 ;
  (*ker).k[1] = 5.0;
  (*ker).k[2] = 8.0 ;
  (*ker).k[3] = 5.0 ;
  (*ker).k[4] = 1.0 ;
  (*ker).m = 5 ;
  (*ker).f = 20.0 ;
}